

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

HighsInt create(HighsIndexCollection *index_collection,HighsInt *mask,HighsInt dimension)

{
  allocator_type local_29;
  vector<int,std::allocator<int>> local_28 [24];
  
  if (-1 < dimension) {
    index_collection->dimension_ = dimension;
    index_collection->is_mask_ = true;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              (local_28,mask,mask + (uint)dimension,&local_29);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&index_collection->mask_,local_28);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_28);
    return 0;
  }
  return 1;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection, const HighsInt* mask,
                const HighsInt dimension) {
  // Create an index collection for the given mask
  if (dimension < 0) return kIndexCollectionCreateIllegalMaskSize;
  index_collection.dimension_ = dimension;
  index_collection.is_mask_ = true;
  index_collection.mask_ = {mask, mask + dimension};
  return kIndexCollectionCreateOk;
}